

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

void duckdb::RadixSortLSD
               (BufferManager *buffer_manager,data_ptr_t *dataptr,idx_t *count,idx_t *col_offset,
               idx_t *row_width,idx_t *sorting_size)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  size_t size;
  data_ptr_t pdVar7;
  byte *pbVar8;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  long lVar12;
  idx_t i;
  data_ptr_t pdVar13;
  bool bVar14;
  AllocatedData temp_block;
  idx_t counts [256];
  
  iVar4 = (*buffer_manager->_vptr_BufferManager[0x14])();
  Allocator::Allocate(&temp_block,(Allocator *)CONCAT44(extraout_var,iVar4),*row_width * *count);
  bVar3 = false;
  for (uVar6 = 1; uVar5 = *sorting_size, uVar6 <= uVar5; uVar6 = uVar6 + 1) {
    switchD_004a0b15::default(counts,0,0x800);
    pdVar1 = *dataptr;
    pdVar7 = pdVar1;
    if (bVar3) {
      pdVar7 = temp_block.pointer;
    }
    lVar12 = (uVar5 - uVar6) + *col_offset;
    pbVar8 = pdVar7 + lVar12;
    uVar5 = *count;
    size = *row_width;
    uVar9 = uVar5;
    while (bVar14 = uVar9 != 0, uVar9 = uVar9 - 1, bVar14) {
      counts[*pbVar8] = counts[*pbVar8] + 1;
      pbVar8 = pbVar8 + size;
    }
    uVar9 = counts[0];
    iVar10 = counts[0];
    for (lVar11 = 1; lVar11 != 0x100; lVar11 = lVar11 + 1) {
      uVar2 = counts[lVar11];
      if (uVar9 <= uVar2) {
        uVar9 = uVar2;
      }
      iVar10 = iVar10 + uVar2;
      counts[lVar11] = iVar10;
    }
    pdVar13 = temp_block.pointer;
    if (bVar3) {
      pdVar13 = pdVar1;
    }
    if (uVar9 != uVar5) {
      pdVar7 = pdVar7 + (uVar5 - 1) * size;
      for (uVar9 = 0; uVar9 < uVar5; uVar9 = uVar9 + 1) {
        iVar10 = counts[pdVar7[lVar12]];
        counts[pdVar7[lVar12]] = iVar10 - 1;
        FastMemcpy(pdVar13 + (iVar10 - 1) * size,pdVar7,size);
        size = *row_width;
        pdVar7 = pdVar7 + -size;
        uVar5 = *count;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
  }
  if (bVar3) {
    switchD_00917c1c::default(*dataptr,temp_block.pointer,*row_width * *count);
  }
  AllocatedData::~AllocatedData(&temp_block);
  return;
}

Assistant:

void RadixSortLSD(BufferManager &buffer_manager, const data_ptr_t &dataptr, const idx_t &count, const idx_t &col_offset,
                  const idx_t &row_width, const idx_t &sorting_size) {
	auto temp_block = buffer_manager.GetBufferAllocator().Allocate(count * row_width);
	bool swap = false;

	idx_t counts[SortConstants::VALUES_PER_RADIX];
	for (idx_t r = 1; r <= sorting_size; r++) {
		// Init counts to 0
		memset(counts, 0, sizeof(counts));
		// Const some values for convenience
		const data_ptr_t source_ptr = swap ? temp_block.get() : dataptr;
		const data_ptr_t target_ptr = swap ? dataptr : temp_block.get();
		const idx_t offset = col_offset + sorting_size - r;
		// Collect counts
		data_ptr_t offset_ptr = source_ptr + offset;
		for (idx_t i = 0; i < count; i++) {
			counts[*offset_ptr]++;
			offset_ptr += row_width;
		}
		// Compute offsets from counts
		idx_t max_count = counts[0];
		for (idx_t val = 1; val < SortConstants::VALUES_PER_RADIX; val++) {
			max_count = MaxValue<idx_t>(max_count, counts[val]);
			counts[val] = counts[val] + counts[val - 1];
		}
		if (max_count == count) {
			continue;
		}
		// Re-order the data in temporary array
		data_ptr_t row_ptr = source_ptr + (count - 1) * row_width;
		for (idx_t i = 0; i < count; i++) {
			idx_t &radix_offset = --counts[*(row_ptr + offset)];
			FastMemcpy(target_ptr + radix_offset * row_width, row_ptr, row_width);
			row_ptr -= row_width;
		}
		swap = !swap;
	}
	// Move data back to original buffer (if it was swapped)
	if (swap) {
		memcpy(dataptr, temp_block.get(), count * row_width);
	}
}